

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainter.cpp
# Opt level: O2

void __thiscall QPainter::save(QPainter *this)

{
  unique_ptr<QPainterState,_std::default_delete<QPainterState>_> *state;
  _Head_base<0UL,_QPainterPrivate_*,_false> this_00;
  QPaintEngineEx *pQVar1;
  QPainterState *pQVar2;
  int iVar3;
  undefined4 extraout_var;
  QPaintEngineState *pQVar4;
  long in_FS_OFFSET;
  _Head_base<0UL,_QPainterState_*,_false> local_58;
  _Head_base<0UL,_QPainterState_*,_false> local_50;
  unique_ptr<QPainterState,_std::default_delete<QPainterState>_> local_48;
  undefined4 uStack_40;
  undefined8 uStack_3c;
  undefined4 local_34;
  char *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00._M_head_impl =
       (this->d_ptr)._M_t.
       super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
       super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
       super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl;
  if (((this_00._M_head_impl)->engine)._M_t.
      super___uniq_ptr_impl<QPaintEngine,_QPainterPrivate::QPaintEngineDestructor>._M_t.
      super__Tuple_impl<0UL,_QPaintEngine_*,_QPainterPrivate::QPaintEngineDestructor>.
      super__Head_base<0UL,_QPaintEngine_*,_false>._M_head_impl == (QPaintEngine *)0x0) {
    local_48._M_t.super___uniq_ptr_impl<QPainterState,_std::default_delete<QPainterState>_>._M_t.
    super__Tuple_impl<0UL,_QPainterState_*,_std::default_delete<QPainterState>_>.
    super__Head_base<0UL,_QPainterState_*,_false>._M_head_impl._0_4_ = 2;
    local_34 = 0;
    local_48._M_t.super___uniq_ptr_impl<QPainterState,_std::default_delete<QPainterState>_>._M_t.
    super__Tuple_impl<0UL,_QPainterState_*,_std::default_delete<QPainterState>_>.
    super__Head_base<0UL,_QPainterState_*,_false>._M_head_impl._4_4_ = 0;
    uStack_40 = 0;
    uStack_3c = 0;
    local_30 = "default";
    QMessageLogger::warning((char *)&local_48,"QPainter::save: Painter not active");
  }
  else {
    pQVar1 = (this_00._M_head_impl)->extended;
    state = &(this_00._M_head_impl)->state;
    if (pQVar1 == (QPaintEngineEx *)0x0) {
      QPainterPrivate::updateState(this_00._M_head_impl,state);
      std::make_unique<QPainterState,QPainterState*>(&local_58._M_head_impl);
      std::
      __exchange<std::unique_ptr<QPainterState,std::default_delete<QPainterState>>,std::unique_ptr<QPainterState,std::default_delete<QPainterState>>>
                ((unique_ptr<QPainterState,_std::default_delete<QPainterState>_> *)&local_50,state);
      local_48._M_t.super___uniq_ptr_impl<QPainterState,_std::default_delete<QPainterState>_>._M_t.
      super__Tuple_impl<0UL,_QPainterState_*,_std::default_delete<QPainterState>_>.
      super__Head_base<0UL,_QPainterState_*,_false>._M_head_impl._0_4_ =
           SUB84(local_50._M_head_impl,0);
      local_48._M_t.super___uniq_ptr_impl<QPainterState,_std::default_delete<QPainterState>_>._M_t.
      super__Tuple_impl<0UL,_QPainterState_*,_std::default_delete<QPainterState>_>.
      super__Head_base<0UL,_QPainterState_*,_false>._M_head_impl._4_4_ =
           (undefined4)((ulong)local_50._M_head_impl >> 0x20);
      local_50._M_head_impl = (QPainterState *)0x0;
      if (local_58._M_head_impl != (QPainterState *)0x0) {
        (*(local_58._M_head_impl)->_vptr_QPainterState[1])();
      }
      pQVar2 = ((this_00._M_head_impl)->state)._M_t.
               super___uniq_ptr_impl<QPainterState,_std::default_delete<QPainterState>_>._M_t.
               super__Tuple_impl<0UL,_QPainterState_*,_std::default_delete<QPainterState>_>.
               super__Head_base<0UL,_QPainterState_*,_false>._M_head_impl;
      pQVar4 = &pQVar2->super_QPaintEngineState;
      if (pQVar2 == (QPainterState *)0x0) {
        pQVar4 = (QPaintEngineState *)0x0;
      }
      (((this_00._M_head_impl)->engine)._M_t.
       super___uniq_ptr_impl<QPaintEngine,_QPainterPrivate::QPaintEngineDestructor>._M_t.
       super__Tuple_impl<0UL,_QPaintEngine_*,_QPainterPrivate::QPaintEngineDestructor>.
       super__Head_base<0UL,_QPaintEngine_*,_false>._M_head_impl)->state = pQVar4;
    }
    else {
      iVar3 = (*(pQVar1->super_QPaintEngine)._vptr_QPaintEngine[0x18])
                        (pQVar1,((this_00._M_head_impl)->state)._M_t.
                                super___uniq_ptr_impl<QPainterState,_std::default_delete<QPainterState>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_QPainterState_*,_std::default_delete<QPainterState>_>
                                .super__Head_base<0UL,_QPainterState_*,_false>._M_head_impl);
      local_50._M_head_impl = (QPainterState *)CONCAT44(extraout_var,iVar3);
      std::
      __exchange<std::unique_ptr<QPainterState,std::default_delete<QPainterState>>,std::unique_ptr<QPainterState,std::default_delete<QPainterState>>>
                ((unique_ptr<QPainterState,_std::default_delete<QPainterState>_> *)&local_58,state);
      local_48._M_t.super___uniq_ptr_impl<QPainterState,_std::default_delete<QPainterState>_>._M_t.
      super__Tuple_impl<0UL,_QPainterState_*,_std::default_delete<QPainterState>_>.
      super__Head_base<0UL,_QPainterState_*,_false>._M_head_impl._0_4_ =
           SUB84(local_58._M_head_impl,0);
      local_48._M_t.super___uniq_ptr_impl<QPainterState,_std::default_delete<QPainterState>_>._M_t.
      super__Tuple_impl<0UL,_QPainterState_*,_std::default_delete<QPainterState>_>.
      super__Head_base<0UL,_QPainterState_*,_false>._M_head_impl._4_4_ =
           (undefined4)((ulong)local_58._M_head_impl >> 0x20);
      (*((this_00._M_head_impl)->extended->super_QPaintEngine)._vptr_QPaintEngine[0x2f])
                ((this_00._M_head_impl)->extended,
                 ((this_00._M_head_impl)->state)._M_t.
                 super___uniq_ptr_impl<QPainterState,_std::default_delete<QPainterState>_>._M_t.
                 super__Tuple_impl<0UL,_QPainterState_*,_std::default_delete<QPainterState>_>.
                 super__Head_base<0UL,_QPainterState_*,_false>._M_head_impl);
      if (local_50._M_head_impl != (QPainterState *)0x0) {
        (*(local_50._M_head_impl)->_vptr_QPainterState[1])();
      }
    }
    QVarLengthArray<std::unique_ptr<QPainterState,std::default_delete<QPainterState>>,8ll>::
    emplace_back<std::unique_ptr<QPainterState,std::default_delete<QPainterState>>>
              ((QVarLengthArray<std::unique_ptr<QPainterState,std::default_delete<QPainterState>>,8ll>
                *)&(this_00._M_head_impl)->savedStates,&local_48);
    if ((long *)CONCAT44(local_48._M_t.
                         super___uniq_ptr_impl<QPainterState,_std::default_delete<QPainterState>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_QPainterState_*,_std::default_delete<QPainterState>_>
                         .super__Head_base<0UL,_QPainterState_*,_false>._M_head_impl._4_4_,
                         local_48._M_t.
                         super___uniq_ptr_impl<QPainterState,_std::default_delete<QPainterState>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_QPainterState_*,_std::default_delete<QPainterState>_>
                         .super__Head_base<0UL,_QPainterState_*,_false>._M_head_impl._0_4_) !=
        (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_48._M_t.
                                     super___uniq_ptr_impl<QPainterState,_std::default_delete<QPainterState>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_QPainterState_*,_std::default_delete<QPainterState>_>
                                     .super__Head_base<0UL,_QPainterState_*,_false>._M_head_impl.
                                     _4_4_,local_48._M_t.
                                           super___uniq_ptr_impl<QPainterState,_std::default_delete<QPainterState>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_QPainterState_*,_std::default_delete<QPainterState>_>
                                           .super__Head_base<0UL,_QPainterState_*,_false>.
                                           _M_head_impl._0_4_) + 8))();
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPainter::save()
{
#ifdef QT_DEBUG_DRAW
    if (qt_show_painter_debug_output)
        printf("QPainter::save()\n");
#endif
    Q_D(QPainter);
    if (!d->engine) {
        qWarning("QPainter::save: Painter not active");
        return;
    }

    std::unique_ptr<QPainterState> prev;
    if (d->extended) {
        // separate the creation of a new state from the update of d->state, since some
        // engines access d->state directly (not via createState()'s argument)
        std::unique_ptr<QPainterState> next(d->extended->createState(d->state.get()));
        prev = std::exchange(d->state, std::move(next));
        d->extended->setState(d->state.get());
    } else {
        d->updateState(d->state);
        prev = std::exchange(d->state, std::make_unique<QPainterState>(d->state.get()));
        d->engine->state = d->state.get();
    }
    d->savedStates.push(std::move(prev));
}